

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O2

void nv12_rgb24_std(uint32_t width,uint32_t height,uint8_t *Y,uint8_t *UV,uint32_t Y_stride,
                   uint32_t UV_stride,uint8_t *RGB,uint32_t RGB_stride,YCbCrType yuv_type)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint8_t *puVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  
  uVar10 = (ulong)yuv_type;
  iVar9 = RGB_stride * 2;
  iVar8 = Y_stride * 2;
  uVar13 = 0;
  uVar20 = 0;
  for (uVar16 = 0; uVar16 < height - 1; uVar16 = uVar16 + 2) {
    uVar19 = (uVar16 >> 1) * UV_stride;
    puVar17 = RGB;
    for (lVar11 = 0; (uint)lVar11 < width - 1; lVar11 = lVar11 + 2) {
      uVar1 = UV[lVar11 + (ulong)uVar19 + 1];
      bVar2 = YUV2RGB[uVar10].y_factor;
      bVar3 = YUV2RGB[uVar10].y_offset;
      iVar14 = (int)(((uint)Y[lVar11 + uVar13] - (uint)bVar3) * (uint)bVar2) >> 7;
      iVar12 = (int)((uint)YUV2RGB[uVar10].cr_factor * ((int)(char)uVar1 ^ 0xffffff80U)) >> 6;
      iVar21 = iVar14 + iVar12;
      if (0xfe < (short)iVar21) {
        iVar21 = 0xff;
      }
      if ((short)iVar21 < 1) {
        iVar21 = 0;
      }
      uVar4 = UV[lVar11 + (ulong)uVar19];
      bVar5 = YUV2RGB[uVar10].cb_factor;
      bVar6 = YUV2RGB[uVar10].g_cb_factor;
      bVar7 = YUV2RGB[uVar10].g_cr_factor;
      puVar17[uVar20] = (uint8_t)iVar21;
      iVar21 = (int)((uint)bVar7 * ((int)(char)uVar1 ^ 0xffffff80U) +
                    (uint)bVar6 * ((int)(char)uVar4 ^ 0xffffff80U)) >> 7;
      iVar18 = iVar14 - iVar21;
      if (0xfe < (short)iVar18) {
        iVar18 = 0xff;
      }
      if ((short)iVar18 < 1) {
        iVar18 = 0;
      }
      puVar17[(ulong)uVar20 + 1] = (uint8_t)iVar18;
      iVar18 = (int)((uint)bVar5 * ((int)(char)uVar4 ^ 0xffffff80U)) >> 6;
      iVar14 = iVar14 + iVar18;
      if (0xfe < (short)iVar14) {
        iVar14 = 0xff;
      }
      if ((short)iVar14 < 1) {
        iVar14 = 0;
      }
      puVar17[(ulong)uVar20 + 2] = (uint8_t)iVar14;
      iVar15 = (int)(((uint)Y[lVar11 + uVar13 + 1] - (uint)bVar3) * (uint)bVar2) >> 7;
      iVar14 = iVar15 + iVar12;
      if (0xfe < (short)iVar14) {
        iVar14 = 0xff;
      }
      if ((short)iVar14 < 1) {
        iVar14 = 0;
      }
      puVar17[(ulong)uVar20 + 3] = (uint8_t)iVar14;
      iVar14 = iVar15 - iVar21;
      if (0xfe < (short)iVar14) {
        iVar14 = 0xff;
      }
      if ((short)iVar14 < 1) {
        iVar14 = 0;
      }
      puVar17[(ulong)uVar20 + 4] = (uint8_t)iVar14;
      iVar15 = iVar15 + iVar18;
      if (0xfe < (short)iVar15) {
        iVar15 = 0xff;
      }
      if ((short)iVar15 < 1) {
        iVar15 = 0;
      }
      puVar17[(ulong)uVar20 + 5] = (uint8_t)iVar15;
      iVar15 = (int)(((uint)Y[lVar11 + (ulong)Y_stride] - (uint)bVar3) * (uint)bVar2) >> 7;
      iVar14 = iVar15 + iVar12;
      if (0xfe < (short)iVar14) {
        iVar14 = 0xff;
      }
      if ((short)iVar14 < 1) {
        iVar14 = 0;
      }
      puVar17[RGB_stride] = (uint8_t)iVar14;
      iVar14 = iVar15 - iVar21;
      if (0xfe < (short)iVar14) {
        iVar14 = 0xff;
      }
      if ((short)iVar14 < 1) {
        iVar14 = 0;
      }
      puVar17[(ulong)RGB_stride + 1] = (uint8_t)iVar14;
      iVar15 = iVar15 + iVar18;
      if (0xfe < (short)iVar15) {
        iVar15 = 0xff;
      }
      if ((short)iVar15 < 1) {
        iVar15 = 0;
      }
      puVar17[(ulong)RGB_stride + 2] = (uint8_t)iVar15;
      iVar14 = (int)(((uint)Y[lVar11 + (ulong)Y_stride + 1] - (uint)bVar3) * (uint)bVar2) >> 7;
      iVar12 = iVar12 + iVar14;
      if (0xfe < (short)iVar12) {
        iVar12 = 0xff;
      }
      if ((short)iVar12 < 1) {
        iVar12 = 0;
      }
      puVar17[(ulong)RGB_stride + 3] = (uint8_t)iVar12;
      iVar21 = iVar14 - iVar21;
      if (0xfe < (short)iVar21) {
        iVar21 = 0xff;
      }
      if ((short)iVar21 < 1) {
        iVar21 = 0;
      }
      puVar17[(ulong)RGB_stride + 4] = (uint8_t)iVar21;
      iVar14 = iVar14 + iVar18;
      if (0xfe < (short)iVar14) {
        iVar14 = 0xff;
      }
      if ((short)iVar14 < 1) {
        iVar14 = 0;
      }
      puVar17[(ulong)RGB_stride + 5] = (uint8_t)iVar14;
      puVar17 = puVar17 + 6;
    }
    RGB_stride = RGB_stride + iVar9;
    uVar20 = uVar20 + iVar9;
    Y_stride = Y_stride + iVar8;
    uVar13 = (ulong)(uint)((int)uVar13 + iVar8);
  }
  return;
}

Assistant:

void nv12_rgb24_std(
	uint32_t width, uint32_t height, 
	const uint8_t *Y, const uint8_t *UV, uint32_t Y_stride, uint32_t UV_stride, 
	uint8_t *RGB, uint32_t RGB_stride, 
	YCbCrType yuv_type)
{
	const YUV2RGBParam *const param = &(YUV2RGB[yuv_type]);
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*uv_ptr=UV+(y/2)*UV_stride;
		
		uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		for(x=0; x<(width-1); x+=2)
		{
			int8_t u_tmp, v_tmp;
			u_tmp = uv_ptr[0]-128;
			v_tmp = uv_ptr[1]-128;
			
			//compute Cb Cr color offsets, common to four pixels
			int16_t b_cb_offset, r_cr_offset, g_cbcr_offset;
			b_cb_offset = (param->cb_factor*u_tmp)>>6;
			r_cr_offset = (param->cr_factor*v_tmp)>>6;
			g_cbcr_offset = (param->g_cb_factor*u_tmp + param->g_cr_factor*v_tmp)>>7;
			
			int16_t y_tmp;
			y_tmp = (param->y_factor*(y_ptr1[0]-param->y_offset))>>7;
			rgb_ptr1[0] = clamp(y_tmp + r_cr_offset);
			rgb_ptr1[1] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr1[2] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr1[1]-param->y_offset))>>7;
			rgb_ptr1[3] = clamp(y_tmp + r_cr_offset);
			rgb_ptr1[4] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr1[5] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr2[0]-param->y_offset))>>7;
			rgb_ptr2[0] = clamp(y_tmp + r_cr_offset);
			rgb_ptr2[1] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr2[2] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr2[1]-param->y_offset))>>7;
			rgb_ptr2[3] = clamp(y_tmp + r_cr_offset);
			rgb_ptr2[4] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr2[5] = clamp(y_tmp + b_cb_offset);
			
			rgb_ptr1 += 6;
			rgb_ptr2 += 6;
			y_ptr1 += 2;
			y_ptr2 += 2;
			uv_ptr += 2;
		}
	}
}